

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

void test_readcb(int fd,short what,void *_arg)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  ulong len;
  long lVar5;
  time_t rtt_ms;
  dns_header_t *hdr;
  size_t pktlen;
  char buf [4096];
  char ip_str [55];
  timeval rtt;
  timeval tv;
  dns_test_request_t *req;
  void *_arg_local;
  short what_local;
  int fd_local;
  
  if (((((what & 1U) == 0) &&
       (len = recvfrom(fd,&pktlen,0x1000,0,(sockaddr *)0x0,(socklen_t *)0x0),
       len != 0xffffffffffffffff)) && (0xb < len)) &&
     (((pktlen._2_2_ >> 8 & 0xf) == 0 && ((short)pktlen == *(short *)((long)_arg + 0x28))))) {
    fmt_sockaddr_port((sockaddr *)(*(long *)((long)_arg + 0x18) + 0x10),buf + 0xff8,0x37);
    gettimeofday((timeval *)&rtt.tv_usec,(__timezone_ptr_t)0x0);
    register0x00000000 = rtt.tv_usec - *(long *)((long)_arg + 8);
    rtt.tv_sec = tv.tv_sec - *(long *)((long)_arg + 0x10);
    if (rtt.tv_sec < 0) {
      register0x00000000 = register0x00000000 + -1;
      rtt.tv_sec = rtt.tv_sec + 1000000;
    }
    lVar5 = rtt.tv_sec / 1000;
    *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) =
         *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) | 0x8000;
    if ((*(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) & 1) == 0) {
      uVar2 = dns_get_edns_udp_payload_size((char *)&pktlen,len);
      *(uint16_t *)(*(long *)((long)_arg + 0x18) + 0x92) = uVar2;
      if ((*(short *)(*(long *)((long)_arg + 0x18) + 0x92) != 0) &&
         ((*(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) & 0x4000) == 0)) {
        _Var1 = is_google_dns((sockaddr *)(*(long *)((long)_arg + 0x18) + 0x10));
        if ((_Var1) && (*(short *)(*(long *)((long)_arg + 0x18) + 0x92) != 0x200)) {
          *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) =
               *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) | 0x4000;
        }
        if ((*(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) & 0x4000) != 0) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x2dc,"test_readcb",0,6,
                     "Oops! DNS server %s is hijacked with UDP payload size: %u",buf + 0xff8,
                     (uint)*(ushort *)(*(long *)((long)_arg + 0x18) + 0x92));
        }
      }
      if ((*(short *)(*(long *)((long)_arg + 0x18) + 0x92) != 0) &&
         ((*(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) & 0x4000) == 0)) {
        *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) =
             *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) | 1;
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x2e2,"test_readcb",0,6,
                   "Cool! DNS server %s supports EDNS with UDP payload size: %u",buf + 0xff8,
                   (uint)*(ushort *)(*(long *)((long)_arg + 0x18) + 0x92));
      }
    }
    if (((*(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) & 0x4002) == 0) &&
       (uVar3 = ntohs(buf._0_2_), uVar3 != 0)) {
      *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) =
           *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) | 2;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2e8
                 ,"test_readcb",0,6,"Cool! DNS server %s returns authority records",buf + 0xff8);
    }
    if (*(short *)(*(long *)((long)_arg + 0x18) + 0x92) == 0) {
      rtt.tv_usec = (ulong)g_cdns_cfg.timeout - stack0xffffffffffffffc0;
      if (0 < rtt.tv_sec) {
        rtt.tv_usec = rtt.tv_usec + -1;
      }
      iVar4 = event_add(*(undefined8 *)((long)_arg + 0x20),&rtt.tv_usec);
      if (iVar4 == 0) {
        return;
      }
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2f5
                 ,"test_readcb",1,3,"event_add");
    }
    else {
      *(int *)(*(long *)((long)_arg + 0x18) + 0xa4) =
           (int)stack0xffffffffffffffc0 * 1000 + (int)lVar5;
    }
  }
  if (*(long *)((long)_arg + 0x20) != 0) {
    event_free(*(undefined8 *)((long)_arg + 0x20));
  }
  free(_arg);
  evutil_closesocket(fd);
  return;
}

Assistant:

static void test_readcb(int fd, short what, void *_arg)
{
    struct dns_test_request_t * req = _arg;
    struct timeval tv, rtt;
    char   ip_str[INET_ADDR_PORT_STRLEN];
    char   buf[DEFAULT_BUFFER_SIZE];
    size_t pktlen;
    struct dns_header_t * hdr = (struct dns_header_t *)buf;

    if (what & EV_TIMEOUT)
        goto finish;

    pktlen = recvfrom(fd, buf, sizeof(buf), 0, NULL, NULL);
    if (pktlen == -1 || pktlen < sizeof(*hdr) || (hdr->rcode != DNS_RC_NOERROR))
        goto finish;

    if (hdr->id != req->id)
        goto finish;

    fmt_sockaddr_port((struct sockaddr *)&req->server->addr, &ip_str[0], sizeof(ip_str));
    gettimeofday(&tv, 0);
    timersub(&tv, &req->test_start, &rtt);
    time_t rtt_ms = rtt.tv_sec * 1000 + rtt.tv_usec/1000;

    req->server->flags |= SF_TEST_DONE;// Server receives response

    /*
    if (req->server->hijack_threshold > 0 && rtt_ms <= req->server->hijack_threshold) {
        log_error(LOG_DEBUG,
                  "Ignore fast response from %s in %ldms(Threshold: %ums)!",
                  &ip_str[0], rtt_ms, req->server->hijack_threshold);
    }
    */
    if (!(req->server->flags & SF_EDNS_OPT)) {
        req->server->edns_udp_size = dns_get_edns_udp_payload_size(&buf[0], pktlen);

        if (req->server->edns_udp_size && !(req->server->flags & SF_HIJACKED)) {
            if (is_google_dns((const struct sockaddr *)&req->server->addr)
                && req->server->edns_udp_size != 512) {
                req->server->flags |= SF_HIJACKED;
            }
            if (req->server->flags & SF_HIJACKED) {
                log_error(LOG_INFO, "Oops! DNS server %s is hijacked with UDP payload size: %u",
                          &ip_str[0], req->server->edns_udp_size);
            }
        }
        if (req->server->edns_udp_size && !(req->server->flags & SF_HIJACKED)) {
            req->server->flags |= SF_EDNS_OPT;
            log_error(LOG_INFO, "Cool! DNS server %s supports EDNS with UDP payload size: %u",
                      &ip_str[0], req->server->edns_udp_size);
        }
    }
    if (!(req->server->flags & (SF_NSCOUNT | SF_HIJACKED))) {
        if (ntohs(hdr->nscount) > 0) {
            req->server->flags |= SF_NSCOUNT;
            log_error(LOG_INFO, "Cool! DNS server %s returns authority records", &ip_str[0]);
        }
    }
    if (req->server->edns_udp_size) {
        // FIXME: update server average rtt
        req->server->stats.avg_rtt = rtt_ms;
    }
    else {
        // Set timeout and wait for next response.
        tv.tv_sec = g_cdns_cfg.timeout;
        tv.tv_usec = 0;
        timersub(&tv, &rtt, &tv);
        if (event_add(req->resolver, &tv)) {
            log_errno(LOG_ERR, "event_add");
            goto finish;
        }    
        return;
    }
finish:
    if (req->resolver)
        event_free(req->resolver);
    free(req);
    evutil_closesocket(fd);
}